

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_6176c::AssertInt8Equals
               (uint8_t expected,char *s,ParseIntTypeCombo parse_type)

{
  ParseIntTypeCombo parse_type_local;
  char *s_local;
  uint8_t expected_local;
  
  (anonymous_namespace)::
  AssertIntEquals<unsigned_char,wabt::Result(&)(char_const*,char_const*,unsigned_char*,wabt::ParseIntType)>
            (expected,s,wabt::ParseInt8,parse_type);
  return;
}

Assistant:

void AssertInt8Equals(uint8_t expected,
                      const char* s,
                      ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt8, parse_type);
}